

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeTest_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  long lVar1;
  int iVar2;
  Fts5ExprTerm *pTerm_00;
  Fts5Expr *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  Fts5IndexIter *pIter;
  i64 iRowid;
  Fts5ExprTerm *pTerm;
  Fts5ExprPhrase *pPhrase;
  int bDesc;
  int bMatch;
  int j;
  int i;
  Fts5ExprPhrase *pLeft;
  Fts5ExprNearset *pNear;
  i64 iLast;
  int rc;
  int *in_stack_ffffffffffffff98;
  Fts5ExprNode *piLast;
  uint bDesc_00;
  int iVar3;
  int iVar4;
  int iVar5;
  Fts5ExprTerm *pTerm_01;
  Fts5ExprNode *pNode_00;
  int *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNode_00 = (Fts5ExprNode *)in_RSI->apExprPhrase;
  pTerm_01 = (Fts5ExprTerm *)pNode_00->iRowid;
  bDesc_00 = in_RDI[6];
  if (pTerm_01[1].pIter == (Fts5IndexIter *)0x0) {
    local_18 = (int *)**(undefined8 **)&pTerm_01[1].nQueryTerm;
  }
  else {
    local_18 = (int *)fts5ExprSynonymRowid((Fts5ExprTerm *)&pTerm_01->pSynonym,bDesc_00,(int *)0x0);
  }
  do {
    iVar3 = 1;
    for (iVar5 = 0; iVar5 < *(int *)&pNode_00->xNext; iVar5 = iVar5 + 1) {
      piLast = pNode_00->apChild[(long)iVar5 + -3];
      for (iVar4 = 0; iVar4 < (int)piLast->iRowid; iVar4 = iVar4 + 1) {
        pTerm_00 = (Fts5ExprTerm *)(piLast->apChild + (long)iVar4 * 5 + -2);
        if (pTerm_00->pSynonym == (Fts5ExprTerm *)0x0) {
          if (*(int **)piLast[1].apChild[(long)iVar4 * 5 + -6] != local_18) {
            iVar3 = 0;
            iVar2 = fts5ExprAdvanceto((Fts5IndexIter *)CONCAT44(iVar5,iVar4),0,(i64 *)piLast,
                                      (int *)pTerm_00,in_stack_ffffffffffffff98);
            if (iVar2 != 0) goto LAB_0027300b;
          }
        }
        else {
          in_stack_ffffffffffffff98 = (int *)fts5ExprSynonymRowid(pTerm_00,bDesc_00,(int *)0x0);
          if (in_stack_ffffffffffffff98 != local_18) {
            iVar3 = 0;
            iVar2 = fts5ExprSynonymAdvanceto(pTerm_01,iVar5,(i64 *)(ulong)bDesc_00,&piLast->eType);
            if (iVar2 != 0) {
              *(undefined4 *)&in_RSI->pConfig = 0;
              *(undefined4 *)((long)&in_RSI->pIndex + 4) = 1;
              goto LAB_0027300b;
            }
          }
        }
      }
    }
  } while (iVar3 == 0);
  *(int **)&in_RSI->bDesc = local_18;
  iVar5 = fts5ExprNearTest(in_RDI,in_RSI,pNode_00);
  *(uint *)&in_RSI->pConfig = (uint)(iVar5 == 0);
LAB_0027300b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5ExprNodeTest_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode
){
  Fts5ExprNearset *pNear = pNode->pNear;
  Fts5ExprPhrase *pLeft = pNear->apPhrase[0];
  int rc = SQLITE_OK;
  i64 iLast;                      /* Lastest rowid any iterator points to */
  int i, j;                       /* Phrase and token index, respectively */
  int bMatch;                     /* True if all terms are at the same rowid */
  const int bDesc = pExpr->bDesc;

  /* Check that this node should not be FTS5_TERM */
  assert( pNear->nPhrase>1
       || pNear->apPhrase[0]->nTerm>1
       || pNear->apPhrase[0]->aTerm[0].pSynonym
       || pNear->apPhrase[0]->aTerm[0].bFirst
  );

  /* Initialize iLast, the "lastest" rowid any iterator points to. If the
  ** iterator skips through rowids in the default ascending order, this means
  ** the maximum rowid. Or, if the iterator is "ORDER BY rowid DESC", then it
  ** means the minimum rowid.  */
  if( pLeft->aTerm[0].pSynonym ){
    iLast = fts5ExprSynonymRowid(&pLeft->aTerm[0], bDesc, 0);
  }else{
    iLast = pLeft->aTerm[0].pIter->iRowid;
  }

  do {
    bMatch = 1;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      for(j=0; j<pPhrase->nTerm; j++){
        Fts5ExprTerm *pTerm = &pPhrase->aTerm[j];
        if( pTerm->pSynonym ){
          i64 iRowid = fts5ExprSynonymRowid(pTerm, bDesc, 0);
          if( iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprSynonymAdvanceto(pTerm, bDesc, &iLast, &rc) ){
            pNode->bNomatch = 0;
            pNode->bEof = 1;
            return rc;
          }
        }else{
          Fts5IndexIter *pIter = pPhrase->aTerm[j].pIter;
          if( pIter->iRowid==iLast ) continue;
          bMatch = 0;
          if( fts5ExprAdvanceto(pIter, bDesc, &iLast, &rc, &pNode->bEof) ){
            return rc;
          }
        }
      }
    }
  }while( bMatch==0 );

  pNode->iRowid = iLast;
  pNode->bNomatch = ((0==fts5ExprNearTest(&rc, pExpr, pNode)) && rc==SQLITE_OK);
  assert( pNode->bEof==0 || pNode->bNomatch==0 );

  return rc;
}